

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bms_exception.cpp
# Opt level: O3

string * __thiscall
InvalidFormatAsStopSequenceException::Message_abi_cxx11_
          (string *__return_storage_ptr__,InvalidFormatAsStopSequenceException *this)

{
  ostream *poVar1;
  stringstream ss;
  string local_1c0;
  stringstream local_1a0 [16];
  ostream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>(local_190,"Wrong STOP Value found: ",0x18);
  BmsWord::ToString_abi_cxx11_(&local_1c0,&this->word);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     (local_190,local_1c0._M_dataplus._M_p,local_1c0._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1," = ",3);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar1,(this->value)._M_dataplus._M_p,(this->value)._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  std::ios_base::~ios_base(local_120);
  return __return_storage_ptr__;
}

Assistant:

std::string
InvalidFormatAsStopSequenceException::Message(void) const
{
	std::stringstream ss;
	ss << "Wrong STOP Value found: " << word.ToString() << " = " << value;
	return ss.str();
}